

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetIssuanceBlindingKey
              (void *handle,char *master_blinding_key,char *txid,uint32_t vout,char **blinding_key)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ElementsTransactionApi api;
  Privkey privkey;
  allocator local_d3;
  allocator local_d2;
  ElementsTransactionApi local_d1;
  undefined1 local_d0 [32];
  string local_b0;
  Txid local_90;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(master_blinding_key);
  if (bVar1) {
    local_d0._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_d0._8_4_ = 0x41d;
    local_d0._16_8_ = "CfdGetIssuanceBlindingKey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,
               "master blinding key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. master blinding key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    if (blinding_key != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_50,master_blinding_key,&local_d2);
      cfd::core::Privkey::Privkey((Privkey *)&local_b0,&local_50,kMainnet,true);
      std::__cxx11::string::string((string *)&local_70,txid,&local_d3);
      cfd::core::Txid::Txid(&local_90,&local_70);
      cfd::api::ElementsTransactionApi::GetIssuanceBlindingKey
                ((Privkey_conflict *)local_d0,&local_d1,(Privkey_conflict *)&local_b0,&local_90,vout
                );
      local_90._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_b0._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_b0,(Privkey *)local_d0);
      pcVar2 = cfd::capi::CreateString(&local_b0);
      *blinding_key = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((pointer)local_d0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d0._0_8_);
      }
      return 0;
    }
    local_d0._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_d0._8_4_ = 0x429;
    local_d0._16_8_ = "CfdGetIssuanceBlindingKey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"blinding key is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. blinding key is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_d0._8_4_ = 0x423;
  local_d0._16_8_ = "CfdGetIssuanceBlindingKey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_d0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetIssuanceBlindingKey(
    void* handle, const char* master_blinding_key, const char* txid,
    uint32_t vout, char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    ElementsTransactionApi api;
    Privkey privkey = api.GetIssuanceBlindingKey(
        Privkey(std::string(master_blinding_key)), Txid(txid),
        static_cast<int32_t>(vout));

    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}